

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O0

void RGBLoop(void)

{
  uchar uVar1;
  undefined4 local_14;
  undefined4 local_10;
  int k_1;
  int k;
  int j;
  
  for (k_1 = 0; k_1 < 3; k_1 = k_1 + 1) {
    for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
      uVar1 = (uchar)local_10;
      if (k_1 == 0) {
        setAll(uVar1,'\0','\0');
      }
      else if (k_1 == 1) {
        setAll('\0',uVar1,'\0');
      }
      else if (k_1 == 2) {
        setAll('\0','\0',uVar1);
      }
      showStrip();
      delay(3);
    }
    for (local_14 = 0xff; -1 < local_14; local_14 = local_14 + -1) {
      uVar1 = (uchar)local_14;
      if (k_1 == 0) {
        setAll(uVar1,'\0','\0');
      }
      else if (k_1 == 1) {
        setAll('\0',uVar1,'\0');
      }
      else if (k_1 == 2) {
        setAll('\0','\0',uVar1);
      }
      showStrip();
      delay(3);
    }
  }
  return;
}

Assistant:

void RGBLoop() {
    for (int j = 0; j < 3; j++) {
        // Fade IN
        for (int k = 0; k < 256; k++) {
            switch (j) {
                case 0:
                    setAll(k, 0, 0);
                    break;
                case 1:
                    setAll(0, k, 0);
                    break;
                case 2:
                    setAll(0, 0, k);
                    break;
            }
            showStrip();
            delay(3);
        }
        // Fade OUT
        for (int k = 255; k >= 0; k--) {
            switch (j) {
                case 0:
                    setAll(k, 0, 0);
                    break;
                case 1:
                    setAll(0, k, 0);
                    break;
                case 2:
                    setAll(0, 0, k);
                    break;
            }
            showStrip();
            delay(3);
        }
    }
}